

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImGuiWindow *window;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiID id;
  ImGuiColumns *pIVar4;
  ImGuiColumnData *pIVar5;
  int n;
  int iVar6;
  ImGuiContext *g;
  ImVector<ImGuiColumnData> *this;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImGuiColumnData local_4c;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count >= 1 && columns_count <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x1d0a,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((window->DC).CurrentColumns == (ImGuiColumns *)0x0) {
    id = GetColumnsID(str_id,columns_count);
    pIVar4 = FindOrCreateColumns(window,id);
    if (pIVar4->ID == id) {
      pIVar4->Current = 0;
      pIVar4->Count = columns_count;
      pIVar4->Flags = flags;
      (window->DC).CurrentColumns = pIVar4;
      pIVar4->HostCursorPosY = (window->DC).CursorPos.y;
      pIVar4->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
      IVar2 = (window->ClipRect).Max;
      (pIVar4->HostClipRect).Min = (window->ClipRect).Min;
      (pIVar4->HostClipRect).Max = IVar2;
      IVar2 = (window->WorkRect).Max;
      (pIVar4->HostWorkRect).Min = (window->WorkRect).Min;
      (pIVar4->HostWorkRect).Max = IVar2;
      fVar1 = (pIVar3->Style).ItemSpacing.x;
      fVar8 = (window->WindowPadding).x;
      fVar10 = fVar1 - fVar8;
      fVar8 = fVar8 * 0.5;
      uVar7 = -(uint)(window->WindowBorderSize <= fVar8);
      fVar9 = (window->WorkRect).Max.x;
      fVar10 = (float)(-(uint)(0.0 <= fVar10) & (uint)fVar10);
      fVar11 = (fVar1 + fVar9) - fVar10;
      fVar9 = (float)(int)(float)(~uVar7 & (uint)window->WindowBorderSize | (uint)fVar8 & uVar7) +
              fVar9;
      if (fVar9 <= fVar11) {
        fVar11 = fVar9;
      }
      fVar10 = ((window->DC).Indent.x - fVar1) + fVar10;
      pIVar4->OffMinX = fVar10;
      fVar11 = fVar11 - (window->Pos).x;
      fVar10 = fVar10 + 1.0;
      uVar7 = -(uint)(fVar10 <= fVar11);
      pIVar4->OffMaxX = (float)(~uVar7 & (uint)fVar10 | (uint)fVar11 & uVar7);
      fVar8 = (window->DC).CursorPos.y;
      pIVar4->LineMaxY = fVar8;
      pIVar4->LineMinY = fVar8;
      this = &pIVar4->Columns;
      iVar6 = (pIVar4->Columns).Size;
      if (iVar6 != columns_count + 1 && iVar6 != 0) {
        ImVector<ImGuiColumnData>::resize(this,0);
        iVar6 = this->Size;
      }
      pIVar4->IsFirstFrame = iVar6 == 0;
      if (iVar6 == 0) {
        ImVector<ImGuiColumnData>::reserve(this,columns_count + 1);
        for (iVar6 = 0; iVar6 <= columns_count; iVar6 = iVar6 + 1) {
          local_4c.ClipRect.Max.x = 0.0;
          local_4c.ClipRect.Max.y = 0.0;
          local_4c.OffsetNormBeforeResize = 0.0;
          local_4c.Flags = 0;
          local_4c.ClipRect.Min.x = 0.0;
          local_4c.ClipRect.Min.y = 0.0;
          local_4c.OffsetNorm = (float)iVar6 / (float)columns_count;
          ImVector<ImGuiColumnData>::push_back(this,&local_4c);
        }
      }
      iVar6 = 0;
      while (columns_count != iVar6) {
        pIVar5 = ImVector<ImGuiColumnData>::operator[](this,iVar6);
        fVar8 = (window->Pos).x;
        fVar11 = GetColumnOffset(iVar6);
        fVar9 = (window->Pos).x;
        iVar6 = iVar6 + 1;
        fVar10 = GetColumnOffset(iVar6);
        (pIVar5->ClipRect).Min.x = (float)(int)(fVar11 + fVar8 + 0.5);
        (pIVar5->ClipRect).Min.y = -3.4028235e+38;
        (pIVar5->ClipRect).Max.x = (float)(int)(fVar10 + fVar9 + -1.0 + 0.5);
        (pIVar5->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWith(&pIVar5->ClipRect,&window->ClipRect);
      }
      if (1 < pIVar4->Count) {
        ImDrawList::ChannelsSplit(window->DrawList,pIVar4->Count + 1);
        ImDrawList::ChannelsSetCurrent(window->DrawList,1);
        PushColumnClipRect(0);
      }
      fVar8 = GetColumnOffset(pIVar4->Current);
      fVar9 = GetColumnOffset(pIVar4->Current + 1);
      PushItemWidth((fVar9 - fVar8) * 0.65);
      fVar11 = fVar1 - (window->WindowPadding).x;
      fVar11 = (float)(-(uint)(0.0 <= fVar11) & (uint)fVar11);
      (window->DC).ColumnsOffset.x = fVar11;
      fVar8 = (window->Pos).x;
      (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar8 + fVar11);
      (window->WorkRect).Max.x = (fVar9 + fVar8) - fVar1;
      return;
    }
    __assert_fail("columns->ID == id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x1d10,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  __assert_fail("window->DC.CurrentColumns == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                ,0x1d0b,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1 && columns_count <= 64);   // Maximum 64 columns
    IM_ASSERT(window->DC.CurrentColumns == NULL);           // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}